

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void embree::SceneGraph::set_motion_vector
               (Ref<embree::SceneGraph::Node> *node,avector<Vec3fa> *motion_vector)

{
  undefined8 uVar1;
  undefined8 uVar2;
  _func_int **pp_Var3;
  __int_type _Var4;
  ulong uVar5;
  reference pvVar6;
  RefCount *pRVar7;
  undefined8 *puVar8;
  size_type sVar9;
  Ref<embree::SceneGraph::Node> *in_RSI;
  long *in_RDI;
  size_t i_32;
  avector<Vec3fa> tpositions_5;
  size_t t_6;
  avector<Vec3fa> positions_5;
  Ref<embree::SceneGraph::SubdivMeshNode> mesh_5;
  size_t t_5;
  size_t i_26;
  avector<Vec3ff> tpositions_4;
  size_t t_4;
  avector<Vec3ff> positions_4;
  Ref<embree::SceneGraph::PointSetNode> mesh_4;
  size_t i_20;
  avector<Vec3ff> tpositions_3;
  size_t t_3;
  avector<Vec3ff> positions_3;
  Ref<embree::SceneGraph::HairSetNode> mesh_3;
  size_t i_14;
  avector<Vec3fa> tpositions_2;
  size_t t_2;
  avector<Vec3fa> positions_2;
  Ref<embree::SceneGraph::GridMeshNode> mesh_2;
  size_t i_8;
  avector<Vec3fa> tpositions_1;
  size_t t_1;
  avector<Vec3fa> positions_1;
  Ref<embree::SceneGraph::QuadMeshNode> mesh_1;
  size_t i_2;
  avector<Vec3fa> tpositions;
  size_t t;
  avector<Vec3fa> positions;
  Ref<embree::SceneGraph::TriangleMeshNode> mesh;
  size_t i;
  Ref<embree::SceneGraph::GroupNode> groupNode;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  vint4 mask;
  vint4 mask_1;
  size_t i_31;
  size_t i_13;
  size_t i_7;
  size_t i_1;
  size_t i_36;
  size_t i_35;
  size_t i_33;
  size_t i_34;
  size_t i_18;
  size_t i_17;
  size_t i_15;
  size_t i_16;
  size_t i_12;
  size_t i_11;
  size_t i_9;
  size_t i_10;
  size_t i_6;
  size_t i_5;
  size_t i_3;
  size_t i_4;
  size_t i_30;
  size_t i_29;
  size_t i_27;
  size_t i_28;
  size_t i_24;
  size_t i_23;
  size_t i_21;
  size_t i_22;
  size_t i_25;
  size_t i_19;
  value_type *in_stack_ffffffffffffe688;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_ffffffffffffe690;
  value_type *in_stack_ffffffffffffe698;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_ffffffffffffe6a0;
  long *local_1858;
  long *local_1778;
  long *local_16c8;
  long *local_1620;
  long *local_1578;
  long *local_14d0;
  long *local_1480;
  avector<Vec3fa> *local_1440;
  undefined8 local_1428;
  undefined8 uStack_1420;
  ulong local_1418;
  undefined1 local_1410 [8];
  ulong local_1408;
  ulong local_1400;
  void *local_13f8;
  Node *local_13f0;
  undefined1 local_13e8 [8];
  size_t local_13e0;
  size_t local_13d8;
  Vec3fa *local_13d0;
  long *local_13c8;
  Node *local_13c0;
  _func_int **local_13b8;
  ulong uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  ulong local_1390;
  undefined1 local_1388 [8];
  ulong local_1380;
  ulong local_1378;
  void *local_1370;
  Node *local_1368;
  undefined1 local_1360 [8];
  size_t local_1358;
  size_t local_1350;
  Vec3fx *local_1348;
  long *local_1340;
  _func_int **local_1338;
  ulong uStack_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  ulong local_1310;
  undefined1 local_1308 [8];
  ulong local_1300;
  ulong local_12f8;
  void *local_12f0;
  Node *local_12e8;
  undefined1 local_12e0 [8];
  size_t local_12d8;
  size_t local_12d0;
  Vec3fx *local_12c8;
  long *local_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  ulong local_12a0;
  undefined1 local_1298 [8];
  ulong local_1290;
  ulong local_1288;
  void *local_1280;
  Node *local_1278;
  undefined1 local_1270 [8];
  size_t local_1268;
  size_t local_1260;
  Vec3fa *local_1258;
  long *local_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  ulong local_1230;
  undefined1 local_1228 [8];
  ulong local_1220;
  ulong local_1218;
  void *local_1210;
  Node *local_1208;
  undefined1 local_1200 [8];
  size_t local_11f8;
  size_t local_11f0;
  Vec3fa *local_11e8;
  long *local_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  ulong local_11c8;
  undefined1 local_11c0 [8];
  ulong local_11b8;
  ulong local_11b0;
  void *local_11a8;
  Node *local_11a0;
  undefined1 local_1198 [8];
  size_t local_1190;
  size_t local_1188;
  Vec3fa *local_1180;
  long *local_1178;
  Node *local_1170;
  ulong local_1168;
  long *local_1160;
  Vec3fa *local_1158;
  undefined8 local_c78;
  undefined8 uStack_c70;
  _func_int **local_c68;
  ulong uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  _func_int **local_c48;
  ulong uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined4 local_c24;
  RefCount *local_c20;
  _func_int ***local_c18;
  _func_int ***local_c10;
  _func_int **local_c08;
  ulong uStack_c00;
  _func_int ***local_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  _func_int **local_bd8;
  ulong uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  _func_int **local_bb8;
  ulong uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined4 local_b94;
  RefCount *local_b90;
  _func_int ***local_b88;
  _func_int ***local_b80;
  _func_int **local_b78;
  ulong uStack_b70;
  _func_int ***local_b60;
  long **local_b58;
  reference local_b48;
  undefined1 *local_b40;
  reference local_b38;
  undefined1 *local_b30;
  reference local_b28;
  undefined1 *local_b20;
  reference local_b18;
  undefined1 *local_b10;
  ulong local_b08;
  undefined1 *local_b00;
  ulong local_af8;
  undefined1 *local_af0;
  ulong local_ae8;
  undefined1 *local_ae0;
  ulong local_ad8;
  undefined1 *local_ad0;
  ulong local_ac8;
  undefined1 *local_ac0;
  ulong local_ab8;
  undefined1 *local_ab0;
  ulong local_aa8;
  undefined1 *local_aa0;
  ulong local_a98;
  undefined1 *local_a90;
  ulong local_a88;
  undefined1 *local_a80;
  ulong local_a78;
  undefined1 *local_a70;
  ulong local_a68;
  undefined1 *local_a60;
  ulong local_a58;
  undefined1 *local_a50;
  Node *local_a48;
  Node *local_a38;
  Node *local_a28;
  Node *local_a18;
  Node *local_a08;
  Node *local_9f8;
  undefined8 *local_9e8;
  undefined8 *local_9e0;
  undefined8 *local_9d8;
  undefined8 *local_9d0;
  undefined8 *local_9c8;
  undefined8 *local_9c0;
  undefined8 *local_9b8;
  undefined8 *local_9b0;
  reference local_9a8;
  undefined1 *local_9a0;
  reference local_998;
  undefined1 *local_990;
  ulong local_988;
  undefined1 *local_980;
  size_t local_978;
  undefined1 *local_970;
  long *local_968;
  long **local_960;
  long *local_958;
  long **local_950;
  long *local_948;
  long **local_940;
  long *local_938;
  long **local_930;
  undefined8 local_928;
  ulong uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  ulong uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined4 local_864;
  undefined8 *local_860;
  undefined4 local_854;
  undefined8 *local_850;
  undefined4 local_848;
  undefined4 uStack_844;
  undefined4 uStack_840;
  undefined4 uStack_83c;
  undefined4 local_838;
  undefined4 local_828;
  undefined4 uStack_824;
  undefined4 uStack_820;
  undefined4 uStack_81c;
  undefined4 local_818;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 *local_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 *local_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  float local_7a8;
  float fStack_7a4;
  float fStack_7a0;
  float fStack_79c;
  undefined8 *local_790;
  float local_788;
  float fStack_784;
  float fStack_780;
  float fStack_77c;
  undefined8 *local_770;
  float local_768;
  float fStack_764;
  float fStack_760;
  float fStack_75c;
  undefined8 *local_750;
  float local_748;
  float fStack_744;
  float fStack_740;
  float fStack_73c;
  undefined8 *local_738;
  undefined4 local_730;
  undefined4 local_72c;
  undefined4 local_728;
  undefined4 local_724;
  undefined8 *local_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined4 local_700;
  undefined4 local_6fc;
  undefined4 local_6f8;
  undefined4 local_6f4;
  undefined4 local_6f0;
  undefined4 local_6ec;
  undefined4 local_6e8;
  undefined4 local_6e4;
  undefined8 *local_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined4 local_6c8;
  undefined4 local_6c4;
  undefined4 local_6c0;
  undefined4 local_6bc;
  undefined8 *local_6b8;
  _func_int ***local_6b0;
  undefined8 *local_6a8;
  _func_int ***local_6a0;
  _func_int **local_698;
  ulong uStack_690;
  _func_int ***local_680;
  undefined8 *local_678;
  _func_int ***local_670;
  undefined8 *local_668;
  undefined8 *local_660;
  _func_int **local_658;
  ulong uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 *local_638;
  _func_int ***local_630;
  undefined8 *local_628;
  _func_int ***local_620;
  _func_int **local_618;
  ulong uStack_610;
  _func_int ***local_600;
  undefined8 *local_5f8;
  _func_int ***local_5f0;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  _func_int **local_5d8;
  ulong uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 *local_5b8;
  undefined8 *local_5b0;
  undefined4 local_5a8;
  undefined4 uStack_5a4;
  undefined4 uStack_5a0;
  undefined4 uStack_59c;
  _func_int **local_598;
  ulong uStack_590;
  undefined4 local_588;
  undefined4 uStack_584;
  undefined4 uStack_580;
  undefined4 uStack_57c;
  _func_int **local_578;
  ulong uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  avector<Vec3fa> *local_520;
  undefined1 *local_518;
  long *local_510;
  long **local_508;
  long *local_500;
  long **local_4f8;
  long *local_4f0;
  long **local_4e8;
  ulong local_4e0;
  ulong local_4d8;
  undefined1 *local_4d0;
  void *local_4c8;
  ulong local_4c0;
  undefined1 *local_4b8;
  ulong local_4b0;
  ulong local_4a8;
  undefined1 *local_4a0;
  void *local_498;
  ulong local_490;
  undefined1 *local_488;
  ulong local_480;
  ulong local_478;
  undefined1 *local_470;
  void *local_468;
  ulong local_460;
  undefined1 *local_458;
  ulong local_450;
  ulong local_448;
  undefined1 *local_440;
  void *local_438;
  ulong local_430;
  undefined1 *local_428;
  ulong local_410;
  undefined1 *local_408;
  ulong local_3f0;
  undefined1 *local_3e8;
  ulong local_3d0;
  undefined1 *local_3c8;
  ulong local_3b0;
  undefined1 *local_3a8;
  ulong local_390;
  undefined1 *local_388;
  ulong local_370;
  undefined1 *local_368;
  ulong local_350;
  undefined1 *local_348;
  ulong local_330;
  undefined1 *local_328;
  ulong local_320;
  void *local_318;
  undefined1 *local_310;
  size_t local_2f0;
  Vec3fa *local_2e8;
  undefined1 *local_2e0;
  ulong local_2c0;
  void *local_2b8;
  undefined1 *local_2b0;
  size_t local_290;
  Vec3fa *local_288;
  undefined1 *local_280;
  ulong local_260;
  void *local_258;
  undefined1 *local_250;
  size_t local_230;
  Vec3fa *local_228;
  undefined1 *local_220;
  ulong local_200;
  void *local_1f8;
  undefined1 *local_1f0;
  size_t local_1d0;
  Vec3fa *local_1c8;
  undefined1 *local_1c0;
  ulong local_190;
  undefined1 *local_188;
  ulong local_170;
  undefined1 *local_168;
  ulong local_150;
  undefined1 *local_148;
  ulong local_130;
  undefined1 *local_128;
  ulong local_120;
  void *local_118;
  undefined1 *local_110;
  size_t local_f0;
  Vec3fx *local_e8;
  undefined1 *local_e0;
  ulong local_c0;
  void *local_b8;
  undefined1 *local_b0;
  size_t local_90;
  Vec3fx *local_88;
  undefined1 *local_80;
  ulong local_60;
  size_t local_58;
  undefined1 *local_50;
  size_t local_48;
  undefined1 *local_40;
  void *local_38;
  ulong local_30;
  ulong local_28;
  undefined1 *local_20;
  ulong local_18;
  undefined1 *local_10;
  void *local_8;
  
  if (*in_RDI == 0) {
    local_1440 = (avector<Vec3fa> *)0x0;
  }
  else {
    local_1440 = (avector<Vec3fa> *)
                 __dynamic_cast(*in_RDI,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  local_518 = &stack0xffffffffffffeec0;
  local_520 = local_1440;
  if (local_1440 != (avector<Vec3fa> *)0x0) {
    (**(code **)(*(long *)local_1440 + 0x10))();
  }
  if (local_1440 == (avector<Vec3fa> *)0x0) {
    if (*in_RDI == 0) {
      local_1480 = (long *)0x0;
    }
    else {
      local_1480 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&GroupNode::typeinfo,0);
    }
    local_508 = &local_1160;
    local_510 = local_1480;
    local_1160 = local_1480;
    if (local_1480 != (long *)0x0) {
      (**(code **)(*local_1480 + 0x10))();
    }
    if (local_1160 == (long *)0x0) {
      if (*in_RDI == 0) {
        local_14d0 = (long *)0x0;
      }
      else {
        local_14d0 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
      }
      local_4f8 = &local_1178;
      local_500 = local_14d0;
      local_1178 = local_14d0;
      if (local_14d0 != (long *)0x0) {
        (**(code **)(*local_14d0 + 0x10))();
      }
      if (local_1178 == (long *)0x0) {
        if (*in_RDI == 0) {
          local_1578 = (long *)0x0;
        }
        else {
          local_1578 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
        }
        local_960 = &local_11e0;
        local_968 = local_1578;
        local_11e0 = local_1578;
        if (local_1578 != (long *)0x0) {
          (**(code **)(*local_1578 + 0x10))();
        }
        if (local_11e0 == (long *)0x0) {
          if (*in_RDI == 0) {
            local_1620 = (long *)0x0;
          }
          else {
            local_1620 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&GridMeshNode::typeinfo,0);
          }
          local_950 = &local_1250;
          local_958 = local_1620;
          local_1250 = local_1620;
          if (local_1620 != (long *)0x0) {
            (**(code **)(*local_1620 + 0x10))();
          }
          if (local_1250 == (long *)0x0) {
            if (*in_RDI == 0) {
              local_16c8 = (long *)0x0;
            }
            else {
              local_16c8 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&HairSetNode::typeinfo,0);
            }
            local_930 = &local_12c0;
            local_938 = local_16c8;
            local_12c0 = local_16c8;
            if (local_16c8 != (long *)0x0) {
              (**(code **)(*local_16c8 + 0x10))();
            }
            if (local_12c0 == (long *)0x0) {
              if (*in_RDI == 0) {
                local_1778 = (long *)0x0;
              }
              else {
                local_1778 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&PointSetNode::typeinfo,
                                                    0);
              }
              local_4e8 = &local_1340;
              local_4f0 = local_1778;
              local_1340 = local_1778;
              if (local_1778 != (long *)0x0) {
                (**(code **)(*local_1778 + 0x10))();
              }
              if (local_1340 == (long *)0x0) {
                if (*in_RDI == 0) {
                  local_1858 = (long *)0x0;
                }
                else {
                  local_1858 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,
                                                      &SubdivMeshNode::typeinfo,0);
                }
                local_940 = &local_13c8;
                local_948 = local_1858;
                local_13c8 = local_1858;
                if (local_1858 != (long *)0x0) {
                  (**(code **)(*local_1858 + 0x10))();
                }
                if (local_13c8 != (long *)0x0) {
                  local_b18 = std::
                              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                            *)(local_13c8 + 0xe),0);
                  local_b10 = local_13e8;
                  local_13e0 = local_b18->size_active;
                  local_b18->size_active = 0;
                  local_13d8 = local_b18->size_alloced;
                  local_b18->size_alloced = 0;
                  local_13d0 = local_b18->items;
                  local_b18->items = (Vec3fa *)0x0;
                  std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::clear((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           *)0x1d7f67);
                  for (local_13f0 = (Node *)0x0; local_13f0 < in_RSI[1].ptr;
                      local_13f0 = (Node *)((long)&(local_13f0->super_RefCount)._vptr_RefCount + 1))
                  {
                    local_ad8 = local_13e0;
                    local_ad0 = local_1410;
                    local_1408 = 0;
                    local_1400 = 0;
                    local_13f8 = (void *)0x0;
                    local_4d8 = local_13e0;
                    local_4d0 = local_ad0;
                    if (local_13e0 != 0) {
                      local_4c0 = local_13e0;
                      local_4b8 = local_ad0;
                      local_13f8 = alignedMalloc((size_t)in_stack_ffffffffffffe698,
                                                 (size_t)in_stack_ffffffffffffe690);
                      for (local_4e0 = 0; local_4e0 < local_4d8; local_4e0 = local_4e0 + 1) {
                        local_4c8 = (void *)((long)local_13f8 + local_4e0 * 0x10);
                      }
                      local_1400 = local_4d8;
                    }
                    for (local_1418 = 0; local_1418 < local_13e0; local_1418 = local_1418 + 1) {
                      local_ab0 = local_13e8;
                      local_ab8 = local_1418;
                      local_a48 = local_13f0;
                      pRVar7 = &(in_RSI[3].ptr)->super_RefCount + (long)local_13f0;
                      uVar1 = *(undefined8 *)&local_13d0[local_1418].field_0;
                      uVar2 = *(undefined8 *)((long)&local_13d0[local_1418].field_0 + 8);
                      pp_Var3 = pRVar7->_vptr_RefCount;
                      _Var4 = (pRVar7->refCounter).super___atomic_base<unsigned_long>._M_i;
                      local_878._0_4_ = (float)uVar1;
                      local_878._4_4_ = (float)((ulong)uVar1 >> 0x20);
                      uStack_870._0_4_ = (float)uVar2;
                      uStack_870._4_4_ = (float)((ulong)uVar2 >> 0x20);
                      local_888._0_4_ = SUB84(pp_Var3,0);
                      local_888._4_4_ = (float)((ulong)pp_Var3 >> 0x20);
                      uStack_880._0_4_ = (float)_Var4;
                      uStack_880._4_4_ = (float)(_Var4 >> 0x20);
                      local_748 = (float)local_878 + (float)local_888;
                      fStack_744 = local_878._4_4_ + local_888._4_4_;
                      fStack_740 = (float)uStack_870 + (float)uStack_880;
                      fStack_73c = uStack_870._4_4_ + uStack_880._4_4_;
                      local_738 = &local_1428;
                      local_1428 = CONCAT44(fStack_744,local_748);
                      uStack_1420 = CONCAT44(fStack_73c,fStack_740);
                      local_ac8 = local_1418;
                      local_ac0 = local_1410;
                      local_9e0 = (undefined8 *)((long)local_13f8 + local_1418 * 0x10);
                      local_9e8 = &local_1428;
                      *local_9e0 = local_1428;
                      local_9e0[1] = uStack_1420;
                      local_888 = pp_Var3;
                      uStack_880 = _Var4;
                      local_878 = uVar1;
                      uStack_870 = uVar2;
                    }
                    local_1408 = local_1400;
                    std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::push_back(in_stack_ffffffffffffe690,(value_type *)in_stack_ffffffffffffe688);
                    local_3e8 = local_1410;
                    for (local_3f0 = 0; local_3f0 < local_1408; local_3f0 = local_3f0 + 1) {
                    }
                    local_200 = local_1400;
                    local_1f8 = local_13f8;
                    local_1f0 = local_3e8;
                    alignedFree(in_stack_ffffffffffffe688);
                    local_13f8 = (void *)0x0;
                    local_1400 = 0;
                    local_1408 = 0;
                  }
                  local_408 = local_13e8;
                  for (local_410 = 0; local_410 < local_13e0; local_410 = local_410 + 1) {
                  }
                  local_1d0 = local_13d8;
                  local_1c8 = local_13d0;
                  local_1c0 = local_408;
                  alignedFree(in_stack_ffffffffffffe688);
                  local_13d0 = (Vec3fa *)0x0;
                  local_13d8 = 0;
                  local_13e0 = 0;
                }
                if (local_13c8 != (long *)0x0) {
                  (**(code **)(*local_13c8 + 0x18))();
                }
              }
              else {
                local_998 = std::
                            vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                            ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                          *)(local_1340 + 0xf),0);
                local_990 = local_1360;
                local_1358 = local_998->size_active;
                local_998->size_active = 0;
                local_1350 = local_998->size_alloced;
                local_998->size_alloced = 0;
                local_1348 = local_998->items;
                local_998->items = (Vec3fx *)0x0;
                std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::clear((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                         *)0x1d714f);
                for (local_1368 = (Node *)0x0; local_1368 < in_RSI[1].ptr;
                    local_1368 = (Node *)((long)&(local_1368->super_RefCount)._vptr_RefCount + 1)) {
                  local_978 = local_1358;
                  local_970 = local_1388;
                  local_1380 = 0;
                  local_1378 = 0;
                  local_1370 = (void *)0x0;
                  local_58 = local_1358;
                  local_50 = local_970;
                  if (local_1358 != 0) {
                    local_48 = local_1358;
                    local_40 = local_970;
                    local_1370 = alignedMalloc((size_t)in_stack_ffffffffffffe698,
                                               (size_t)in_stack_ffffffffffffe690);
                    for (local_60 = 0; local_60 < local_58; local_60 = local_60 + 1) {
                      local_38 = (void *)((long)local_1370 + local_60 * 0x10);
                    }
                    local_1378 = local_58;
                  }
                  for (local_1390 = 0; local_1390 < local_1358; local_1390 = local_1390 + 1) {
                    local_a38 = local_1368;
                    local_b90 = &(in_RSI[3].ptr)->super_RefCount + (long)local_1368;
                    local_b88 = &local_13b8;
                    local_b94 = 0;
                    local_720 = &local_ba8;
                    local_724 = 0xffffffff;
                    local_728 = 0xffffffff;
                    local_72c = 0xffffffff;
                    local_730 = 0;
                    local_6f4 = 0;
                    local_6f8 = 0xffffffff;
                    local_6fc = 0xffffffff;
                    local_700 = 0xffffffff;
                    local_718 = 0xffffffffffffffff;
                    uStack_710 = 0xffffffff;
                    local_ba8 = 0xffffffffffffffff;
                    uStack_ba0 = 0xffffffff;
                    local_808 = 0xffffffffffffffff;
                    uStack_800 = 0xffffffff;
                    local_7f0 = &local_bc8;
                    local_b78 = local_b90->_vptr_RefCount;
                    uStack_b70 = (local_b90->refCounter).super___atomic_base<unsigned_long>._M_i;
                    local_b60 = &local_bd8;
                    local_860 = &local_be8;
                    local_864 = 0;
                    local_818 = 0;
                    local_828 = 0;
                    uStack_824 = 0;
                    uStack_820 = 0;
                    uStack_81c = 0;
                    local_548 = 0;
                    uStack_540 = 0;
                    local_6a0 = &local_bb8;
                    local_6a8 = &local_bc8;
                    local_6b0 = &local_bd8;
                    local_6b8 = &local_be8;
                    local_648 = 0xffffffffffffffff;
                    uStack_640 = 0xffffffff;
                    uStack_690 = uStack_b70 & 0xffffffff;
                    local_538 = 0xffffffffffffffff;
                    uStack_530 = 0xffffffff;
                    local_588 = 0;
                    uStack_584 = 0;
                    uStack_580 = 0;
                    uStack_57c = 0;
                    local_680 = &local_bb8;
                    local_b80 = &local_bb8;
                    uVar1 = *(undefined8 *)&local_1348[local_1390].field_0;
                    uVar2 = *(undefined8 *)((long)&local_1348[local_1390].field_0 + 8);
                    local_8f8._0_4_ = (float)uVar1;
                    local_8f8._4_4_ = (float)((ulong)uVar1 >> 0x20);
                    uStack_8f0._0_4_ = (float)uVar2;
                    uStack_8f0._4_4_ = (float)((ulong)uVar2 >> 0x20);
                    local_908._0_4_ = SUB84(local_b78,0);
                    local_908._4_4_ = (float)((ulong)local_b78 >> 0x20);
                    uStack_900._0_4_ = (float)uStack_b70;
                    local_13a8 = CONCAT44(local_8f8._4_4_ + local_908._4_4_,
                                          (float)local_8f8 + (float)local_908);
                    uStack_13a0 = CONCAT44(uStack_8f0._4_4_ + 0.0,
                                           (float)uStack_8f0 + (float)uStack_900);
                    puVar8 = (undefined8 *)((long)local_1370 + local_1390 * 0x10);
                    *puVar8 = local_13a8;
                    puVar8[1] = uStack_13a0;
                    local_908 = local_b78;
                    uStack_900 = uStack_690;
                    local_8f8 = uVar1;
                    uStack_8f0 = uVar2;
                    local_7c8 = local_808;
                    uStack_7c0 = uStack_800;
                    local_698 = local_b78;
                    local_678 = local_6b8;
                    local_670 = local_6b0;
                    local_668 = local_6a8;
                    local_660 = local_6a8;
                    local_658 = local_b78;
                    uStack_650 = uStack_b70;
                    local_5b8 = local_720;
                    local_578 = local_b78;
                    uStack_570 = uStack_690;
                    local_13b8 = local_b78;
                    uStack_13b0 = uStack_690;
                    local_be8 = local_548;
                    uStack_be0 = uStack_540;
                    local_bd8 = local_b78;
                    uStack_bd0 = uStack_b70;
                    local_bc8 = local_808;
                    uStack_bc0 = uStack_800;
                    local_bb8 = local_b78;
                    uStack_bb0 = uStack_690;
                  }
                  local_1380 = local_1378;
                  std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::push_back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                               *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
                  local_168 = local_1388;
                  for (local_170 = 0; local_170 < local_1380; local_170 = local_170 + 1) {
                  }
                  local_c0 = local_1378;
                  local_b8 = local_1370;
                  local_b0 = local_168;
                  alignedFree(in_stack_ffffffffffffe688);
                  local_1370 = (void *)0x0;
                  local_1378 = 0;
                  local_1380 = 0;
                }
                sVar9 = std::
                        vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        ::size((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(local_1340 + 0x12));
                if (sVar9 != 0) {
                  for (local_13c0 = (Node *)0x1; local_13c0 < in_RSI[1].ptr;
                      local_13c0 = (Node *)((long)&(local_13c0->super_RefCount)._vptr_RefCount + 1))
                  {
                    std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                  *)(local_1340 + 0x12),0);
                    std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::push_back(in_stack_ffffffffffffe6a0,in_stack_ffffffffffffe698);
                  }
                }
                local_188 = local_1360;
                for (local_190 = 0; local_190 < local_1358; local_190 = local_190 + 1) {
                }
                local_90 = local_1350;
                local_88 = local_1348;
                local_80 = local_188;
                alignedFree(in_stack_ffffffffffffe688);
                local_1348 = (Vec3fx *)0x0;
                local_1350 = 0;
                local_1358 = 0;
              }
              if (local_1340 != (long *)0x0) {
                (**(code **)(*local_1340 + 0x18))();
              }
            }
            else {
              local_9a8 = std::
                          vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                        *)(local_12c0 + 0xf),0);
              local_9a0 = local_12e0;
              local_12d8 = local_9a8->size_active;
              local_9a8->size_active = 0;
              local_12d0 = local_9a8->size_alloced;
              local_9a8->size_alloced = 0;
              local_12c8 = local_9a8->items;
              local_9a8->items = (Vec3fx *)0x0;
              std::
              vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ::clear((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                       *)0x1d6474);
              for (local_12e8 = (Node *)0x0; local_12e8 < in_RSI[1].ptr;
                  local_12e8 = (Node *)((long)&(local_12e8->super_RefCount)._vptr_RefCount + 1)) {
                local_988 = local_12d8;
                local_980 = local_1308;
                local_1300 = 0;
                local_12f8 = 0;
                local_12f0 = (void *)0x0;
                local_28 = local_12d8;
                local_20 = local_980;
                if (local_12d8 != 0) {
                  local_18 = local_12d8;
                  local_10 = local_980;
                  local_12f0 = alignedMalloc((size_t)in_stack_ffffffffffffe698,
                                             (size_t)in_stack_ffffffffffffe690);
                  for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
                    local_8 = (void *)((long)local_12f0 + local_30 * 0x10);
                  }
                  local_12f8 = local_28;
                }
                for (local_1310 = 0; local_1310 < local_12d8; local_1310 = local_1310 + 1) {
                  local_a28 = local_12e8;
                  local_c20 = &(in_RSI[3].ptr)->super_RefCount + (long)local_12e8;
                  local_c18 = &local_1338;
                  local_c24 = 0;
                  local_6e0 = &local_c38;
                  local_6e4 = 0xffffffff;
                  local_6e8 = 0xffffffff;
                  local_6ec = 0xffffffff;
                  local_6f0 = 0;
                  local_6bc = 0;
                  local_6c0 = 0xffffffff;
                  local_6c4 = 0xffffffff;
                  local_6c8 = 0xffffffff;
                  local_6d8 = 0xffffffffffffffff;
                  uStack_6d0 = 0xffffffff;
                  local_c38 = 0xffffffffffffffff;
                  uStack_c30 = 0xffffffff;
                  local_7e8 = 0xffffffffffffffff;
                  uStack_7e0 = 0xffffffff;
                  local_7d0 = &local_c58;
                  local_c08 = local_c20->_vptr_RefCount;
                  uStack_c00 = (local_c20->refCounter).super___atomic_base<unsigned_long>._M_i;
                  local_bf0 = &local_c68;
                  local_850 = &local_c78;
                  local_854 = 0;
                  local_838 = 0;
                  local_848 = 0;
                  uStack_844 = 0;
                  uStack_840 = 0;
                  uStack_83c = 0;
                  local_568 = 0;
                  uStack_560 = 0;
                  local_620 = &local_c48;
                  local_628 = &local_c58;
                  local_630 = &local_c68;
                  local_638 = &local_c78;
                  local_5c8 = 0xffffffffffffffff;
                  uStack_5c0 = 0xffffffff;
                  uStack_610 = uStack_c00 & 0xffffffff;
                  local_558 = 0xffffffffffffffff;
                  uStack_550 = 0xffffffff;
                  local_5a8 = 0;
                  uStack_5a4 = 0;
                  uStack_5a0 = 0;
                  uStack_59c = 0;
                  local_600 = &local_c48;
                  local_c10 = &local_c48;
                  uVar1 = *(undefined8 *)&local_12c8[local_1310].field_0;
                  uVar2 = *(undefined8 *)((long)&local_12c8[local_1310].field_0 + 8);
                  local_918._0_4_ = (float)uVar1;
                  local_918._4_4_ = (float)((ulong)uVar1 >> 0x20);
                  uStack_910._0_4_ = (float)uVar2;
                  uStack_910._4_4_ = (float)((ulong)uVar2 >> 0x20);
                  local_928._0_4_ = SUB84(local_c08,0);
                  local_928._4_4_ = (float)((ulong)local_c08 >> 0x20);
                  uStack_920._0_4_ = (float)uStack_c00;
                  local_1328 = CONCAT44(local_918._4_4_ + local_928._4_4_,
                                        (float)local_918 + (float)local_928);
                  uStack_1320 = CONCAT44(uStack_910._4_4_ + 0.0,
                                         (float)uStack_910 + (float)uStack_920);
                  puVar8 = (undefined8 *)((long)local_12f0 + local_1310 * 0x10);
                  *puVar8 = local_1328;
                  puVar8[1] = uStack_1320;
                  local_928 = local_c08;
                  uStack_920 = uStack_610;
                  local_918 = uVar1;
                  uStack_910 = uVar2;
                  local_7b8 = local_7e8;
                  uStack_7b0 = uStack_7e0;
                  local_618 = local_c08;
                  local_5f8 = local_638;
                  local_5f0 = local_630;
                  local_5e8 = local_628;
                  local_5e0 = local_628;
                  local_5d8 = local_c08;
                  uStack_5d0 = uStack_c00;
                  local_5b0 = local_6e0;
                  local_598 = local_c08;
                  uStack_590 = uStack_610;
                  local_1338 = local_c08;
                  uStack_1330 = uStack_610;
                  local_c78 = local_568;
                  uStack_c70 = uStack_560;
                  local_c68 = local_c08;
                  uStack_c60 = uStack_c00;
                  local_c58 = local_7e8;
                  uStack_c50 = uStack_7e0;
                  local_c48 = local_c08;
                  uStack_c40 = uStack_610;
                }
                local_1300 = local_12f8;
                std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::push_back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                             *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
                local_128 = local_1308;
                for (local_130 = 0; local_130 < local_1300; local_130 = local_130 + 1) {
                }
                local_120 = local_12f8;
                local_118 = local_12f0;
                local_110 = local_128;
                alignedFree(in_stack_ffffffffffffe688);
                local_12f0 = (void *)0x0;
                local_12f8 = 0;
                local_1300 = 0;
              }
              local_148 = local_12e0;
              for (local_150 = 0; local_150 < local_12d8; local_150 = local_150 + 1) {
              }
              local_f0 = local_12d0;
              local_e8 = local_12c8;
              local_e0 = local_148;
              alignedFree(in_stack_ffffffffffffe688);
              local_12c8 = (Vec3fx *)0x0;
              local_12d0 = 0;
              local_12d8 = 0;
            }
            if (local_12c0 != (long *)0x0) {
              (**(code **)(*local_12c0 + 0x18))();
            }
          }
          else {
            local_b28 = std::
                        vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                      *)(local_1250 + 0xe),0);
            local_b20 = local_1270;
            local_1268 = local_b28->size_active;
            local_b28->size_active = 0;
            local_1260 = local_b28->size_alloced;
            local_b28->size_alloced = 0;
            local_1258 = local_b28->items;
            local_b28->items = (Vec3fa *)0x0;
            std::
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ::clear((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                     *)0x1d5ae5);
            for (local_1278 = (Node *)0x0; local_1278 < in_RSI[1].ptr;
                local_1278 = (Node *)((long)&(local_1278->super_RefCount)._vptr_RefCount + 1)) {
              local_ae8 = local_1268;
              local_ae0 = local_1298;
              local_1290 = 0;
              local_1288 = 0;
              local_1280 = (void *)0x0;
              local_4a8 = local_1268;
              local_4a0 = local_ae0;
              if (local_1268 != 0) {
                local_490 = local_1268;
                local_488 = local_ae0;
                local_1280 = alignedMalloc((size_t)in_stack_ffffffffffffe698,
                                           (size_t)in_stack_ffffffffffffe690);
                for (local_4b0 = 0; local_4b0 < local_4a8; local_4b0 = local_4b0 + 1) {
                  local_498 = (void *)((long)local_1280 + local_4b0 * 0x10);
                }
                local_1288 = local_4a8;
              }
              for (local_12a0 = 0; local_12a0 < local_1268; local_12a0 = local_12a0 + 1) {
                local_a90 = local_1270;
                local_a98 = local_12a0;
                local_a18 = local_1278;
                pRVar7 = &(in_RSI[3].ptr)->super_RefCount + (long)local_1278;
                uVar1 = *(undefined8 *)&local_1258[local_12a0].field_0;
                uVar2 = *(undefined8 *)((long)&local_1258[local_12a0].field_0 + 8);
                pp_Var3 = pRVar7->_vptr_RefCount;
                _Var4 = (pRVar7->refCounter).super___atomic_base<unsigned_long>._M_i;
                local_898._0_4_ = (float)uVar1;
                local_898._4_4_ = (float)((ulong)uVar1 >> 0x20);
                uStack_890._0_4_ = (float)uVar2;
                uStack_890._4_4_ = (float)((ulong)uVar2 >> 0x20);
                local_8a8._0_4_ = SUB84(pp_Var3,0);
                local_8a8._4_4_ = (float)((ulong)pp_Var3 >> 0x20);
                uStack_8a0._0_4_ = (float)_Var4;
                uStack_8a0._4_4_ = (float)(_Var4 >> 0x20);
                local_768 = (float)local_898 + (float)local_8a8;
                fStack_764 = local_898._4_4_ + local_8a8._4_4_;
                fStack_760 = (float)uStack_890 + (float)uStack_8a0;
                fStack_75c = uStack_890._4_4_ + uStack_8a0._4_4_;
                local_750 = &local_12b8;
                local_12b8 = CONCAT44(fStack_764,local_768);
                uStack_12b0 = CONCAT44(fStack_75c,fStack_760);
                local_aa8 = local_12a0;
                local_aa0 = local_1298;
                local_9d0 = (undefined8 *)((long)local_1280 + local_12a0 * 0x10);
                local_9d8 = &local_12b8;
                *local_9d0 = local_12b8;
                local_9d0[1] = uStack_12b0;
                local_8a8 = pp_Var3;
                uStack_8a0 = _Var4;
                local_898 = uVar1;
                uStack_890 = uVar2;
              }
              local_1290 = local_1288;
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::push_back(in_stack_ffffffffffffe690,(value_type *)in_stack_ffffffffffffe688);
              local_3a8 = local_1298;
              for (local_3b0 = 0; local_3b0 < local_1290; local_3b0 = local_3b0 + 1) {
              }
              local_260 = local_1288;
              local_258 = local_1280;
              local_250 = local_3a8;
              alignedFree(in_stack_ffffffffffffe688);
              local_1280 = (void *)0x0;
              local_1288 = 0;
              local_1290 = 0;
            }
            local_3c8 = local_1270;
            for (local_3d0 = 0; local_3d0 < local_1268; local_3d0 = local_3d0 + 1) {
            }
            local_230 = local_1260;
            local_228 = local_1258;
            local_220 = local_3c8;
            alignedFree(in_stack_ffffffffffffe688);
            local_1258 = (Vec3fa *)0x0;
            local_1260 = 0;
            local_1268 = 0;
          }
          local_b58 = &local_1250;
          if (local_1250 != (long *)0x0) {
            (**(code **)(*local_1250 + 0x18))();
          }
        }
        else {
          local_b38 = std::
                      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                    *)(local_11e0 + 0xe),0);
          local_b30 = local_1200;
          local_11f8 = local_b38->size_active;
          local_b38->size_active = 0;
          local_11f0 = local_b38->size_alloced;
          local_b38->size_alloced = 0;
          local_11e8 = local_b38->items;
          local_b38->items = (Vec3fa *)0x0;
          std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::clear((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   *)0x1d5156);
          for (local_1208 = (Node *)0x0; local_1208 < in_RSI[1].ptr;
              local_1208 = (Node *)((long)&(local_1208->super_RefCount)._vptr_RefCount + 1)) {
            local_af8 = local_11f8;
            local_af0 = local_1228;
            local_1220 = 0;
            local_1218 = 0;
            local_1210 = (void *)0x0;
            local_478 = local_11f8;
            local_470 = local_af0;
            if (local_11f8 != 0) {
              local_460 = local_11f8;
              local_458 = local_af0;
              local_1210 = alignedMalloc((size_t)in_stack_ffffffffffffe698,
                                         (size_t)in_stack_ffffffffffffe690);
              for (local_480 = 0; local_480 < local_478; local_480 = local_480 + 1) {
                local_468 = (void *)((long)local_1210 + local_480 * 0x10);
              }
              local_1218 = local_478;
            }
            for (local_1230 = 0; local_1230 < local_11f8; local_1230 = local_1230 + 1) {
              local_a70 = local_1200;
              local_a78 = local_1230;
              local_a08 = local_1208;
              pRVar7 = &(in_RSI[3].ptr)->super_RefCount + (long)local_1208;
              uVar1 = *(undefined8 *)&local_11e8[local_1230].field_0;
              uVar2 = *(undefined8 *)((long)&local_11e8[local_1230].field_0 + 8);
              pp_Var3 = pRVar7->_vptr_RefCount;
              _Var4 = (pRVar7->refCounter).super___atomic_base<unsigned_long>._M_i;
              local_8b8._0_4_ = (float)uVar1;
              local_8b8._4_4_ = (float)((ulong)uVar1 >> 0x20);
              uStack_8b0._0_4_ = (float)uVar2;
              uStack_8b0._4_4_ = (float)((ulong)uVar2 >> 0x20);
              local_8c8._0_4_ = SUB84(pp_Var3,0);
              local_8c8._4_4_ = (float)((ulong)pp_Var3 >> 0x20);
              uStack_8c0._0_4_ = (float)_Var4;
              uStack_8c0._4_4_ = (float)(_Var4 >> 0x20);
              local_788 = (float)local_8b8 + (float)local_8c8;
              fStack_784 = local_8b8._4_4_ + local_8c8._4_4_;
              fStack_780 = (float)uStack_8b0 + (float)uStack_8c0;
              fStack_77c = uStack_8b0._4_4_ + uStack_8c0._4_4_;
              local_770 = &local_1248;
              local_1248 = CONCAT44(fStack_784,local_788);
              uStack_1240 = CONCAT44(fStack_77c,fStack_780);
              local_a88 = local_1230;
              local_a80 = local_1228;
              local_9c0 = (undefined8 *)((long)local_1210 + local_1230 * 0x10);
              local_9c8 = &local_1248;
              *local_9c0 = local_1248;
              local_9c0[1] = uStack_1240;
              local_8c8 = pp_Var3;
              uStack_8c0 = _Var4;
              local_8b8 = uVar1;
              uStack_8b0 = uVar2;
            }
            local_1220 = local_1218;
            std::
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ::push_back(in_stack_ffffffffffffe690,(value_type *)in_stack_ffffffffffffe688);
            local_368 = local_1228;
            for (local_370 = 0; local_370 < local_1220; local_370 = local_370 + 1) {
            }
            local_2c0 = local_1218;
            local_2b8 = local_1210;
            local_2b0 = local_368;
            alignedFree(in_stack_ffffffffffffe688);
            local_1210 = (void *)0x0;
            local_1218 = 0;
            local_1220 = 0;
          }
          local_388 = local_1200;
          for (local_390 = 0; local_390 < local_11f8; local_390 = local_390 + 1) {
          }
          local_290 = local_11f0;
          local_288 = local_11e8;
          local_280 = local_388;
          alignedFree(in_stack_ffffffffffffe688);
          local_11e8 = (Vec3fa *)0x0;
          local_11f0 = 0;
          local_11f8 = 0;
        }
        if (local_11e0 != (long *)0x0) {
          (**(code **)(*local_11e0 + 0x18))();
        }
      }
      else {
        local_b48 = std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                  *)(local_1178 + 0xe),0);
        local_b40 = local_1198;
        local_1190 = local_b48->size_active;
        local_b48->size_active = 0;
        local_1188 = local_b48->size_alloced;
        local_b48->size_alloced = 0;
        local_1180 = local_b48->items;
        local_b48->items = (Vec3fa *)0x0;
        std::
        vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        ::clear((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 *)0x1d47c7);
        for (local_11a0 = (Node *)0x0; local_11a0 < in_RSI[1].ptr;
            local_11a0 = (Node *)((long)&(local_11a0->super_RefCount)._vptr_RefCount + 1)) {
          local_b08 = local_1190;
          local_b00 = local_11c0;
          local_11b8 = 0;
          local_11b0 = 0;
          local_11a8 = (void *)0x0;
          local_448 = local_1190;
          local_440 = local_b00;
          if (local_1190 != 0) {
            local_430 = local_1190;
            local_428 = local_b00;
            local_11a8 = alignedMalloc((size_t)in_stack_ffffffffffffe698,
                                       (size_t)in_stack_ffffffffffffe690);
            for (local_450 = 0; local_450 < local_448; local_450 = local_450 + 1) {
              local_438 = (void *)((long)local_11a8 + local_450 * 0x10);
            }
            local_11b0 = local_448;
          }
          for (local_11c8 = 0; local_11c8 < local_1190; local_11c8 = local_11c8 + 1) {
            local_a50 = local_1198;
            local_a58 = local_11c8;
            local_9f8 = local_11a0;
            pRVar7 = &(in_RSI[3].ptr)->super_RefCount + (long)local_11a0;
            uVar1 = *(undefined8 *)&local_1180[local_11c8].field_0;
            uVar2 = *(undefined8 *)((long)&local_1180[local_11c8].field_0 + 8);
            pp_Var3 = pRVar7->_vptr_RefCount;
            _Var4 = (pRVar7->refCounter).super___atomic_base<unsigned_long>._M_i;
            local_8d8._0_4_ = (float)uVar1;
            local_8d8._4_4_ = (float)((ulong)uVar1 >> 0x20);
            uStack_8d0._0_4_ = (float)uVar2;
            uStack_8d0._4_4_ = (float)((ulong)uVar2 >> 0x20);
            local_8e8._0_4_ = SUB84(pp_Var3,0);
            local_8e8._4_4_ = (float)((ulong)pp_Var3 >> 0x20);
            uStack_8e0._0_4_ = (float)_Var4;
            uStack_8e0._4_4_ = (float)(_Var4 >> 0x20);
            local_7a8 = (float)local_8d8 + (float)local_8e8;
            fStack_7a4 = local_8d8._4_4_ + local_8e8._4_4_;
            fStack_7a0 = (float)uStack_8d0 + (float)uStack_8e0;
            fStack_79c = uStack_8d0._4_4_ + uStack_8e0._4_4_;
            local_790 = &local_11d8;
            local_11d8 = CONCAT44(fStack_7a4,local_7a8);
            uStack_11d0 = CONCAT44(fStack_79c,fStack_7a0);
            local_a68 = local_11c8;
            local_a60 = local_11c0;
            local_9b0 = (undefined8 *)((long)local_11a8 + local_11c8 * 0x10);
            local_9b8 = &local_11d8;
            *local_9b0 = local_11d8;
            local_9b0[1] = uStack_11d0;
            local_8e8 = pp_Var3;
            uStack_8e0 = _Var4;
            local_8d8 = uVar1;
            uStack_8d0 = uVar2;
          }
          local_11b8 = local_11b0;
          std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::push_back(in_stack_ffffffffffffe690,(value_type *)in_stack_ffffffffffffe688);
          local_328 = local_11c0;
          for (local_330 = 0; local_330 < local_11b8; local_330 = local_330 + 1) {
          }
          local_320 = local_11b0;
          local_318 = local_11a8;
          local_310 = local_328;
          alignedFree(in_stack_ffffffffffffe688);
          local_11a8 = (void *)0x0;
          local_11b0 = 0;
          local_11b8 = 0;
        }
        local_348 = local_1198;
        for (local_350 = 0; local_350 < local_1190; local_350 = local_350 + 1) {
        }
        local_2f0 = local_1188;
        local_2e8 = local_1180;
        local_2e0 = local_348;
        alignedFree(in_stack_ffffffffffffe688);
        local_1180 = (Vec3fa *)0x0;
        local_1188 = 0;
        local_1190 = 0;
      }
      if (local_1178 != (long *)0x0) {
        (**(code **)(*local_1178 + 0x18))();
      }
    }
    else {
      for (local_1168 = 0; uVar5 = local_1168,
          sVar9 = std::
                  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                  ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                          *)(local_1160 + 0xd)), uVar5 < sVar9; local_1168 = local_1168 + 1) {
        pvVar6 = std::
                 vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                 ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                               *)(local_1160 + 0xd),local_1168);
        local_1170 = pvVar6->ptr;
        if (local_1170 != (Node *)0x0) {
          (*(local_1170->super_RefCount)._vptr_RefCount[2])();
        }
        set_motion_vector(in_RSI,local_1440);
        if (local_1170 != (Node *)0x0) {
          (*(local_1170->super_RefCount)._vptr_RefCount[3])();
        }
      }
    }
    if (local_1160 != (long *)0x0) {
      (**(code **)(*local_1160 + 0x18))();
    }
  }
  else {
    local_1158 = local_1440[4].items;
    if (local_1158 != (Vec3fa *)0x0) {
      (**(code **)(*(long *)&local_1158->field_0 + 0x10))();
    }
    set_motion_vector(in_RSI,local_1440);
    if (local_1158 != (Vec3fa *)0x0) {
      (**(code **)(*(long *)&local_1158->field_0 + 0x18))();
    }
  }
  if (local_1440 != (avector<Vec3fa> *)0x0) {
    (**(code **)(*(long *)local_1440 + 0x18))();
  }
  return;
}

Assistant:

void SceneGraph::set_motion_vector(Ref<SceneGraph::Node> node, const avector<Vec3fa>& motion_vector)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      set_motion_vector(xfmNode->child,motion_vector);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        set_motion_vector(groupNode->children[i],motion_vector);
    }
    else if (Ref<SceneGraph::TriangleMeshNode> mesh = node.dynamicCast<SceneGraph::TriangleMeshNode>()) 
    {
      avector<Vec3fa> positions = std::move(mesh->positions[0]);
      mesh->positions.clear();
      for (size_t t=0; t<motion_vector.size(); t++) {
        avector<Vec3fa> tpositions(positions.size());
        for (size_t i=0; i<positions.size(); i++) tpositions[i] = positions[i] + motion_vector[t];
        mesh->positions.push_back(std::move(tpositions));
      }
    }
    else if (Ref<SceneGraph::QuadMeshNode> mesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) 
    {
      avector<Vec3fa> positions = std::move(mesh->positions[0]);
      mesh->positions.clear();
      for (size_t t=0; t<motion_vector.size(); t++) {
        avector<Vec3fa> tpositions(positions.size());
        for (size_t i=0; i<positions.size(); i++) tpositions[i] = positions[i] + motion_vector[t];
        mesh->positions.push_back(std::move(tpositions));
      }
    }
    else if (Ref<SceneGraph::GridMeshNode> mesh = node.dynamicCast<SceneGraph::GridMeshNode>()) 
    {
      avector<Vec3fa> positions = std::move(mesh->positions[0]);
      mesh->positions.clear();
      for (size_t t=0; t<motion_vector.size(); t++) {
        avector<Vec3fa> tpositions(positions.size());
        for (size_t i=0; i<positions.size(); i++) tpositions[i] = positions[i] + motion_vector[t];
        mesh->positions.push_back(std::move(tpositions));
      }
    }
    else if (Ref<SceneGraph::HairSetNode> mesh = node.dynamicCast<SceneGraph::HairSetNode>()) 
    {
      avector<Vec3ff> positions = std::move(mesh->positions[0]);
      mesh->positions.clear();
      for (size_t t=0; t<motion_vector.size(); t++) {
        avector<Vec3ff> tpositions(positions.size());
        for (size_t i=0; i<positions.size(); i++) tpositions[i] = positions[i] + Vec3ff(motion_vector[t],0.0f);
        mesh->positions.push_back(std::move(tpositions));
      }
    }
    else if (Ref<SceneGraph::PointSetNode> mesh = node.dynamicCast<SceneGraph::PointSetNode>())
    {
      avector<Vec3ff> positions = std::move(mesh->positions[0]);
      mesh->positions.clear();
      for (size_t t=0; t<motion_vector.size(); t++) {
        avector<Vec3ff> tpositions(positions.size());
        for (size_t i=0; i<positions.size(); i++) tpositions[i] = positions[i] + Vec3ff(motion_vector[t],0.0f);
        mesh->positions.push_back(std::move(tpositions));
      }
      if (mesh->normals.size()) {
        for (size_t t=1; t<motion_vector.size(); t++)
          mesh->normals.push_back(mesh->normals[0]);
      }
    }
    else if (Ref<SceneGraph::SubdivMeshNode> mesh = node.dynamicCast<SceneGraph::SubdivMeshNode>())
    {
      avector<Vec3fa> positions = std::move(mesh->positions[0]);
      mesh->positions.clear();
      for (size_t t=0; t<motion_vector.size(); t++) {
        avector<Vec3fa> tpositions(positions.size());
        for (size_t i=0; i<positions.size(); i++) tpositions[i] = positions[i] + motion_vector[t];
        mesh->positions.push_back(std::move(tpositions));
      }
    }
  }